

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error appendAttributeValue
                    (XML_Parser parser,ENCODING *enc,XML_Bool isCdata,char *ptr,char *end,
                    STRING_POOL *pool)

{
  char cVar1;
  char *pcVar2;
  XML_Bool XVar3;
  int iVar4;
  uint uVar5;
  XML_Error XVar6;
  XML_Char *pXVar7;
  NAMED *pNVar8;
  ulong uVar9;
  DTD *table;
  bool bVar10;
  byte bVar11;
  char *next;
  XML_Char buf [4];
  XML_Error local_74;
  char *local_58;
  char local_4c [4];
  DTD *local_48;
  STRING_POOL *local_40;
  char *local_38;
  
  table = parser->m_dtd;
  local_40 = &table->pool;
  local_38 = end;
  do {
    iVar4 = (*enc->literalScanners[0])(enc,ptr,local_38,&local_58);
    bVar11 = 1;
    switch(iVar4) {
    case 0:
      local_74 = XML_ERROR_INVALID_TOKEN;
      if (parser->m_encoding == enc) {
        parser->m_eventPtr = local_58;
      }
      break;
    case 6:
      pXVar7 = poolAppend(pool,enc,ptr,local_58);
      if (pXVar7 == (XML_Char *)0x0) goto LAB_004dbe38;
      goto LAB_004dbff9;
    case 7:
      goto switchD_004dbc4a_caseD_7;
    case 9:
      iVar4 = (*enc->predefinedEntityName)
                        (enc,ptr + enc->minBytesPerChar,local_58 + -(long)enc->minBytesPerChar);
      if ((char)iVar4 == '\0') {
        pXVar7 = poolStoreString(&parser->m_temp2Pool,enc,ptr + enc->minBytesPerChar,
                                 local_58 + -(long)enc->minBytesPerChar);
        bVar11 = 1;
        if (pXVar7 == (XML_Char *)0x0) goto LAB_004dbef2;
        pNVar8 = lookup(parser,&table->generalEntities,pXVar7,0);
        (parser->m_temp2Pool).ptr = (parser->m_temp2Pool).start;
        if (local_40 == pool) {
          if (table->standalone == '\0') {
            bVar10 = table->hasParamEntityRefs == '\0';
          }
          else {
            bVar10 = parser->m_openInternalEntities == (OPEN_INTERNAL_ENTITY *)0x0;
          }
LAB_004dbf45:
          if (bVar10) goto LAB_004dbf49;
          if (pNVar8 == (NAMED *)0x0) goto LAB_004dbd63;
LAB_004dbf6a:
          if (*(char *)&pNVar8[7].name == '\0') {
            if (pNVar8[6].name == (KEY)0x0) {
              pcVar2 = pNVar8[1].name;
              if (pcVar2 != (char *)0x0) {
                *(undefined1 *)&pNVar8[7].name = 1;
                XVar6 = appendAttributeValue
                                  (parser,parser->m_internalEncoding,isCdata,pcVar2,
                                   pcVar2 + *(int *)&pNVar8[2].name,pool);
                *(undefined1 *)&pNVar8[7].name = 0;
                bVar11 = XVar6 != XML_ERROR_NONE;
                if ((bool)bVar11) {
                  local_74 = XVar6;
                }
                goto LAB_004dbff3;
              }
              local_74 = XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
            }
            else {
              local_74 = XML_ERROR_BINARY_ENTITY_REF;
            }
          }
          else {
            local_74 = XML_ERROR_RECURSIVE_ENTITY_REF;
          }
          if (parser->m_encoding == enc) {
            parser->m_eventPtr = ptr;
          }
        }
        else {
          if (table->hasParamEntityRefs != '\0') {
            bVar10 = table->standalone != '\0';
            goto LAB_004dbf45;
          }
LAB_004dbf49:
          if (pNVar8 == (NAMED *)0x0) {
            local_74 = XML_ERROR_UNDEFINED_ENTITY;
          }
          else {
            if (*(char *)((long)&pNVar8[7].name + 2) != '\0') goto LAB_004dbf6a;
            local_74 = XML_ERROR_ENTITY_DECLARED_IN_PE;
          }
        }
      }
      else {
        if ((pool->ptr == pool->end) && (XVar3 = poolGrow(pool), XVar3 == '\0')) {
LAB_004dbef2:
          bVar11 = 1;
          local_74 = XML_ERROR_NO_MEMORY;
          goto LAB_004dbff3;
        }
        pcVar2 = pool->ptr;
        pool->ptr = pcVar2 + 1;
        *pcVar2 = (char)iVar4;
LAB_004dbd63:
        bVar11 = 4;
      }
      goto LAB_004dbff3;
    case 10:
      iVar4 = (*enc->charRefNumber)(enc,ptr);
      if (-1 < iVar4) {
        if ((isCdata == '\0') && (iVar4 == 0x20)) {
          bVar11 = 4;
          if ((pool->ptr == pool->start) || (pool->ptr[-1] == ' ')) goto LAB_004dbff3;
        }
        uVar5 = XmlUtf8Encode(iVar4,local_4c);
        if (uVar5 != 0) {
          bVar11 = 0;
          if (0 < (int)uVar5) {
            local_48 = table;
            uVar9 = 0;
            do {
              if ((pool->ptr == pool->end) && (XVar3 = poolGrow(pool), XVar3 == '\0')) {
                bVar11 = 1;
                local_74 = XML_ERROR_NO_MEMORY;
                table = local_48;
                break;
              }
              cVar1 = local_4c[uVar9];
              pcVar2 = pool->ptr;
              pool->ptr = pcVar2 + 1;
              *pcVar2 = cVar1;
              uVar9 = uVar9 + 1;
              table = local_48;
            } while (uVar5 != uVar9);
          }
          goto LAB_004dbff3;
        }
      }
      if (parser->m_encoding == enc) {
        parser->m_eventPtr = ptr;
      }
      local_74 = XML_ERROR_BAD_CHAR_REF;
      bVar11 = 1;
LAB_004dbff3:
      if ((bVar11 & 3) != 0) break;
      goto LAB_004dbff9;
    case -4:
      local_74 = XML_ERROR_NONE;
      break;
    case -3:
      local_58 = ptr + enc->minBytesPerChar;
      goto switchD_004dbc4a_caseD_7;
    case -2:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 8:
switchD_004dbc4a_caseD_fffffffe:
      local_74 = XML_ERROR_UNEXPECTED_STATE;
      goto LAB_004dbdfe;
    case -1:
      local_74 = XML_ERROR_INVALID_TOKEN;
LAB_004dbdfe:
      if (parser->m_encoding == enc) {
        parser->m_eventPtr = ptr;
      }
      break;
    default:
      if (iVar4 != 0x27) goto switchD_004dbc4a_caseD_fffffffe;
switchD_004dbc4a_caseD_7:
      if ((isCdata != '\0') || ((pool->ptr != pool->start && (pool->ptr[-1] != ' ')))) {
        if ((pool->ptr == pool->end) && (XVar3 = poolGrow(pool), XVar3 == '\0')) {
LAB_004dbe38:
          bVar11 = 1;
          local_74 = XML_ERROR_NO_MEMORY;
          break;
        }
        pXVar7 = pool->ptr;
        pool->ptr = pXVar7 + 1;
        *pXVar7 = ' ';
      }
LAB_004dbff9:
      bVar11 = 0;
      ptr = local_58;
    }
    if (bVar11 != 0) {
      return local_74;
    }
  } while( true );
}

Assistant:

static enum XML_Error
appendAttributeValue(XML_Parser parser, const ENCODING *enc, XML_Bool isCdata,
                     const char *ptr, const char *end,
                     STRING_POOL *pool)
{
  DTD * const dtd = _dtd;  /* save one level of indirection */
  for (;;) {
    const char *next;
    int tok = XmlAttributeValueTok(enc, ptr, end, &next);
    switch (tok) {
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_INVALID:
      if (enc == encoding)
        eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (enc == encoding)
        eventPtr = ptr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, ptr);
        if (n < 0) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        if (!isCdata
            && n == 0x20 /* space */
            && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
          break;
        n = XmlEncode(n, (ICHAR *)buf);
        if (!n) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        for (i = 0; i < n; i++) {
          if (!poolAppendChar(pool, buf[i]))
            return XML_ERROR_NO_MEMORY;
        }
      }
      break;
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, ptr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = ptr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_ATTRIBUTE_VALUE_S:
    case XML_TOK_DATA_NEWLINE:
      if (!isCdata && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
        break;
      if (!poolAppendChar(pool, 0x20))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        char checkEntityDecl;
        XML_Char ch = (XML_Char) XmlPredefinedEntityName(enc,
                                              ptr + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (!poolAppendChar(pool, ch))
                return XML_ERROR_NO_MEMORY;
          break;
        }
        name = poolStoreString(&temp2Pool, enc,
                               ptr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(parser, &dtd->generalEntities, name, 0);
        poolDiscard(&temp2Pool);
        /* First, determine if a check for an existing declaration is needed;
           if yes, check that the entity exists, and that it is internal.
        */
        if (pool == &dtd->pool)  /* are we called from prolog? */
          checkEntityDecl =
#ifdef XML_DTD
              prologState.documentEntity &&
#endif /* XML_DTD */
              (dtd->standalone
               ? !openInternalEntities
               : !dtd->hasParamEntityRefs);
        else /* if (pool == &tempPool): we are called from content */
          checkEntityDecl = !dtd->hasParamEntityRefs || dtd->standalone;
        if (checkEntityDecl) {
          if (!entity)
            return XML_ERROR_UNDEFINED_ENTITY;
          else if (!entity->is_internal)
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
        else if (!entity) {
          /* Cannot report skipped entity here - see comments on
             skippedEntityHandler.
          if (skippedEntityHandler)
            skippedEntityHandler(handlerArg, name, 0);
          */
          /* Cannot call the default handler because this would be
             out of sync with the call to the startElementHandler.
          if ((pool == &tempPool) && defaultHandler)
            reportDefault(parser, enc, ptr, next);
          */
          break;
        }
        if (entity->open) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (entity->notation) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        if (!entity->textPtr) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        }
        else {
          enum XML_Error result;
          const XML_Char *textEnd = entity->textPtr + entity->textLen;
          entity->open = XML_TRUE;
          result = appendAttributeValue(parser, internalEncoding, isCdata,
                                        (char *)entity->textPtr,
                                        (char *)textEnd, pool);
          entity->open = XML_FALSE;
          if (result)
            return result;
        }
      }
      break;
    default:
      if (enc == encoding)
        eventPtr = ptr;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    ptr = next;
  }
  /* not reached */
}